

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueimpl.hpp
# Opt level: O3

UserObject * __thiscall camp::detail::ConvertVisitor<camp::UserObject>::operator()(void)

{
  BadType *__return_storage_ptr__;
  string local_b0;
  string local_90;
  BadType local_70;
  
  __return_storage_ptr__ = (BadType *)__cxa_allocate_exception(0x48);
  BadType::BadType(&local_70,noType,userType);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/detail/valueimpl.hpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "T camp::detail::ConvertVisitor<camp::UserObject>::operator()(NoType) const [T = camp::UserObject]"
             ,"");
  Error::prepare<camp::BadType>(__return_storage_ptr__,&local_70,&local_b0,0x44,&local_90);
  __cxa_throw(__return_storage_ptr__,&BadType::typeinfo,Error::~Error);
}

Assistant:

T operator()(NoType) const
    {
        // Error: trying to convert an empty value
        CAMP_ERROR(BadType(noType, mapType<T>()));
    }